

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O2

ParameterError add_url(GlobalConfig *global,OperationConfig *config,char *thisurl,int extraflags)

{
  ParameterError PVar1;
  getout *pgVar2;
  ulong uVar3;
  
  pgVar2 = config->url_get;
  if (pgVar2 == (getout *)0x0) {
    pgVar2 = config->url_list;
    config->url_get = pgVar2;
    if (pgVar2 == (getout *)0x0) goto LAB_00113016;
  }
  while (pgVar2 != (getout *)0x0) {
    if ((pgVar2->flags & 2) == 0) goto LAB_0011302d;
    pgVar2 = pgVar2->next;
    config->url_get = pgVar2;
  }
LAB_00113016:
  pgVar2 = new_getout(config);
  config->url_get = pgVar2;
  if (pgVar2 == (getout *)0x0) {
    PVar1 = PARAM_NO_MEM;
  }
  else {
LAB_0011302d:
    PVar1 = getstr(&pgVar2->url,thisurl,false);
    pgVar2->flags = extraflags | pgVar2->flags | 2;
    if (PVar1 == PARAM_OK) {
      uVar3 = config->num_urls + 1;
      config->num_urls = uVar3;
      if (uVar3 < 2) {
        PVar1 = PARAM_OK;
      }
      else if ((config->etag_save_file != (char *)0x0) ||
              (PVar1 = PARAM_OK, config->etag_compare_file != (char *)0x0)) {
        errorf(global,"The etag options only work on a single URL");
        PVar1 = PARAM_BAD_USE;
      }
    }
  }
  return PVar1;
}

Assistant:

static ParameterError add_url(struct GlobalConfig *global,
                              struct OperationConfig *config,
                              const char *thisurl,
                              int extraflags)
{
  ParameterError err = PARAM_OK;
  struct getout *url;

  if(!config->url_get)
    config->url_get = config->url_list;

  if(config->url_get) {
    /* there is a node here, if it already is filled-in continue to find
       an "empty" node */
    while(config->url_get && (config->url_get->flags & GETOUT_URL))
      config->url_get = config->url_get->next;
  }

  /* now there might or might not be an available node to fill in! */

  if(config->url_get)
    /* existing node */
    url = config->url_get;
  else
    /* there was no free node, create one! */
    config->url_get = url = new_getout(config);

  if(!url)
    return PARAM_NO_MEM;
  else {
    /* fill in the URL */
    err = getstr(&url->url, thisurl, DENY_BLANK);
    url->flags |= GETOUT_URL | extraflags;
    if(!err && (++config->num_urls > 1) &&
       (config->etag_save_file || config->etag_compare_file)) {
      errorf(global, "The etag options only work on a single URL");
      return PARAM_BAD_USE;
    }
  }
  return err;
}